

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_acode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  block *pbVar1;
  char *fmt;
  
  if ((cstate->linktype == 0x81) || (cstate->linktype == 7)) {
    if (((uint)q & 0xfffe) == 0x100) {
      pbVar1 = gen_ahostop(cstate,eaddr,(uint)q >> 0x10 & 0xff);
      return pbVar1;
    }
    fmt = "ARCnet address used in non-arc expression";
  }
  else {
    fmt = "aid supported only on ARCnet";
  }
  bpf_error(cstate,fmt);
}

Assistant:

struct block *
gen_acode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	switch (cstate->linktype) {

	case DLT_ARCNET:
	case DLT_ARCNET_LINUX:
		if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) &&
		    q.proto == Q_LINK)
			return (gen_ahostop(cstate, eaddr, (int)q.dir));
		else {
			bpf_error(cstate, "ARCnet address used in non-arc expression");
			/* NOTREACHED */
		}
		break;

	default:
		bpf_error(cstate, "aid supported only on ARCnet");
		/* NOTREACHED */
	}
	bpf_error(cstate, "ARCnet address used in non-arc expression");
	/* NOTREACHED */
	return NULL;
}